

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O2

void __thiscall
VectorFormatter<(anonymous_namespace)::EncodedDoubleFormatter>::
Unser<AutoFile,std::vector<double,std::allocator<double>>>
          (VectorFormatter<(anonymous_namespace)::EncodedDoubleFormatter> *this,AutoFile *s,
          vector<double,_std::allocator<double>_> *v)

{
  long lVar1;
  uint64_t uVar2;
  double *v_00;
  ulong __n;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((FILE *)(s->m_xor).super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
              super__Vector_impl_data._M_start != s->m_file) {
    (s->m_xor).super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)s->m_file;
  }
  uVar2 = ReadCompactSize<AutoFile>((AutoFile *)this,true);
  __n = 0;
  while (__n < uVar2) {
    __n = __n + 0x98968;
    if (uVar2 <= __n) {
      __n = uVar2;
    }
    std::vector<double,_std::allocator<double>_>::reserve
              ((vector<double,_std::allocator<double>_> *)s,__n);
    while ((ulong)((long)(s->m_xor).super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                         _M_impl.super__Vector_impl_data._M_start - (long)s->m_file >> 3) < __n) {
      std::vector<double,_std::allocator<double>_>::emplace_back<>
                ((vector<double,_std::allocator<double>_> *)s);
      anon_unknown.dwarf_26adc77::EncodedDoubleFormatter::Unser<AutoFile>
                ((EncodedDoubleFormatter *)this,
                 (AutoFile *)
                 ((s->m_xor).super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                  super__Vector_impl_data._M_start + -8),v_00);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Unser(Stream& s, V& v)
    {
        Formatter formatter;
        v.clear();
        size_t size = ReadCompactSize(s);
        size_t allocated = 0;
        while (allocated < size) {
            // For DoS prevention, do not blindly allocate as much as the stream claims to contain.
            // Instead, allocate in 5MiB batches, so that an attacker actually needs to provide
            // X MiB of data to make us allocate X+5 Mib.
            static_assert(sizeof(typename V::value_type) <= MAX_VECTOR_ALLOCATE, "Vector element size too large");
            allocated = std::min(size, allocated + MAX_VECTOR_ALLOCATE / sizeof(typename V::value_type));
            v.reserve(allocated);
            while (v.size() < allocated) {
                v.emplace_back();
                formatter.Unser(s, v.back());
            }
        }
    }